

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

char * google::protobuf::internal::WireFormat::_InternalParseAndMergeField
                 (Message *msg,char *ptr,ParseContext *ctx,uint64_t tag,Reflection *reflection,
                 FieldDescriptor *field)

{
  anon_class_32_4_91646d40 add;
  FieldDescriptor *this;
  Reflection *tag_00;
  bool bVar1;
  WireType WVar2;
  Type TVar3;
  WireType WVar4;
  int32_t value_16;
  int iVar5;
  CppStringType CVar6;
  uint uVar7;
  UnknownFieldSet *pUVar8;
  Message *pMVar9;
  RepeatedField<int> *pRVar10;
  RepeatedField<long> *pRVar11;
  RepeatedField<unsigned_int> *pRVar12;
  RepeatedField<unsigned_long> *pRVar13;
  RepeatedField<float> *object;
  RepeatedField<double> *object_00;
  RepeatedField<bool> *object_01;
  LogMessage *pLVar14;
  int64_t value_17;
  unsigned_long value_18;
  long value_19;
  WireFormatLite *this_00;
  char *pcVar15;
  float value_20;
  double value_21;
  string_view field_name;
  string local_198;
  string local_178;
  string_view local_158;
  string_view local_148;
  undefined1 local_138 [8];
  string value_14;
  undefined1 local_110 [8];
  Cord value_15;
  int size;
  uint32_t value_13;
  double value_12;
  float value_11;
  int64_t value_10;
  int32_t value_9;
  uint64_t value_8;
  uint32_t value_7;
  int64_t value_6;
  uint64_t uStack_b8;
  int32_t value_5;
  uint64_t value_4;
  unsigned_long uStack_a8;
  uint32_t value_3;
  uint64_t value_2;
  unsigned_long uStack_98;
  uint32_t value_1;
  uint64_t value;
  bool strict_utf8_check;
  bool utf8_check;
  LogMessage local_80;
  Voidify local_69;
  RepeatedField<int> *local_68;
  RepeatedField<int> *local_60;
  FieldDescriptor *local_58;
  char *local_50;
  RepeatedField<int> *local_48;
  RepeatedField<int> *rep_enum;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  uint64_t tag_local;
  ParseContext *ctx_local;
  char *ptr_local;
  Message *msg_local;
  
  rep_enum = (RepeatedField<int> *)field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)tag;
  tag_local = (uint64_t)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)msg;
  if (field == (FieldDescriptor *)0x0) {
    pUVar8 = Reflection::MutableUnknownFields(reflection,msg);
    pMVar9 = (Message *)UnknownFieldParse(tag,pUVar8,(char *)ctx_local,(ParseContext *)tag_local);
    return (char *)pMVar9;
  }
  WVar2 = WireFormatLite::GetTagWireType((uint32_t)tag);
  TVar3 = FieldDescriptor::type((FieldDescriptor *)rep_enum);
  WVar4 = WireTypeForFieldType(TVar3);
  if (WVar2 != WVar4) {
    bVar1 = FieldDescriptor::is_packable((FieldDescriptor *)rep_enum);
    if ((!bVar1) ||
       (WVar2 = WireFormatLite::GetTagWireType((uint32_t)reflection_local),
       WVar2 != WIRETYPE_LENGTH_DELIMITED)) {
      tag_00 = reflection_local;
      pUVar8 = Reflection::MutableUnknownFields((Reflection *)field_local,(Message *)ptr_local);
      pMVar9 = (Message *)
               UnknownFieldParse((uint64_t)tag_00,pUVar8,(char *)ctx_local,(ParseContext *)tag_local
                                );
      return (char *)pMVar9;
    }
    TVar3 = FieldDescriptor::type((FieldDescriptor *)rep_enum);
    switch(TVar3) {
    case TYPE_DOUBLE:
      object_00 = Reflection::MutableRepeatedFieldInternal<double>
                            ((Reflection *)field_local,(Message *)ptr_local,
                             (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedDoubleParser(object_00,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_FLOAT:
      object = Reflection::MutableRepeatedFieldInternal<float>
                         ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum
                         );
      pMVar9 = (Message *)PackedFloatParser(object,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_INT64:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedInt64Parser(pRVar11,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_UINT64:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedUInt64Parser(pRVar13,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_INT32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedInt32Parser(pRVar10,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_FIXED64:
      pRVar13 = Reflection::MutableRepeatedFieldInternal<unsigned_long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedFixed64Parser(pRVar13,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_FIXED32:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<unsigned_int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedFixed32Parser(pRVar12,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_BOOL:
      object_01 = Reflection::MutableRepeatedFieldInternal<bool>
                            ((Reflection *)field_local,(Message *)ptr_local,
                             (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedBoolParser(object_01,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
                 ,0x378);
      pLVar14 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
      pLVar14 = absl::lts_20250127::log_internal::LogMessage::operator<<
                          (pLVar14,(char (*) [12])"Can\'t reach");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_69,pLVar14);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_80);
    case TYPE_UINT32:
      pRVar12 = Reflection::MutableRepeatedFieldInternal<unsigned_int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedUInt32Parser(pRVar12,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_ENUM:
      local_48 = Reflection::MutableRepeatedFieldInternal<int>
                           ((Reflection *)field_local,(Message *)ptr_local,
                            (FieldDescriptor *)rep_enum);
      bVar1 = FieldDescriptor::legacy_enum_field_treated_as_closed((FieldDescriptor *)rep_enum);
      if (!bVar1) {
        pMVar9 = (Message *)PackedEnumParser(local_48,(char *)ctx_local,(ParseContext *)tag_local);
        return (char *)pMVar9;
      }
      local_68 = local_48;
      local_60 = rep_enum;
      local_58 = field_local;
      local_50 = ptr_local;
      add.field = (FieldDescriptor *)rep_enum;
      add.rep_enum = local_48;
      add.reflection = (Reflection *)field_local;
      add.msg = (Message *)ptr_local;
      pMVar9 = (Message *)
               EpsCopyInputStream::
               ReadPackedVarint<google::protobuf::internal::WireFormat::_InternalParseAndMergeField(google::protobuf::Message*,char_const*,google::protobuf::internal::ParseContext*,unsigned_long,google::protobuf::Reflection_const*,google::protobuf::FieldDescriptor_const*)::__0>
                         ((EpsCopyInputStream *)tag_local,(char *)ctx_local,add);
      return (char *)pMVar9;
    case TYPE_SFIXED32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedSFixed32Parser(pRVar10,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_SFIXED64:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedSFixed64Parser(pRVar11,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case TYPE_SINT32:
      pRVar10 = Reflection::MutableRepeatedFieldInternal<int>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedSInt32Parser(pRVar10,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    case MAX_TYPE:
      pRVar11 = Reflection::MutableRepeatedFieldInternal<long>
                          ((Reflection *)field_local,(Message *)ptr_local,
                           (FieldDescriptor *)rep_enum);
      pMVar9 = (Message *)PackedSInt64Parser(pRVar11,(char *)ctx_local,(ParseContext *)tag_local);
      return (char *)pMVar9;
    }
  }
  value._3_1_ = 0;
  value._2_1_ = 0;
  TVar3 = FieldDescriptor::type((FieldDescriptor *)rep_enum);
  switch(TVar3) {
  case TYPE_DOUBLE:
    value_21 = UnalignedLoad<double>((char *)ctx_local);
    ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar1) {
      Reflection::AddDouble
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_21
                );
    }
    else {
      Reflection::SetDouble
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_21
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_FLOAT:
    value_20 = UnalignedLoad<float>((char *)ctx_local);
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar1) {
      Reflection::AddFloat
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_20
                );
    }
    else {
      Reflection::SetFloat
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_20
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_INT64:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_long>((char *)ctx_local,&stack0xffffffffffffff58);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_a8);
      }
      else {
        Reflection::SetInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_a8);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_UINT64:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_long>((char *)ctx_local,&stack0xffffffffffffff48);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddUInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_b8);
      }
      else {
        Reflection::SetUInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   uStack_b8);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_INT32:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_int>((char *)ctx_local,(uint *)((long)&value_2 + 4));
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_2._4_4_);
      }
      else {
        Reflection::SetInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_2._4_4_);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_FIXED64:
    value_18 = UnalignedLoad<unsigned_long>((char *)ctx_local);
    ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar1) {
      Reflection::AddUInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_18
                );
    }
    else {
      Reflection::SetUInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_18
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_FIXED32:
    uVar7 = UnalignedLoad<unsigned_int>((char *)ctx_local);
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar1) {
      Reflection::AddUInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,uVar7);
    }
    else {
      Reflection::SetUInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,uVar7);
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_BOOL:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_long>((char *)ctx_local,&stack0xffffffffffffff68);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddBool((Reflection *)field_local,(Message *)ptr_local,
                            (FieldDescriptor *)rep_enum,uStack_98 != 0);
      }
      else {
        Reflection::SetBool((Reflection *)field_local,(Message *)ptr_local,
                            (FieldDescriptor *)rep_enum,uStack_98 != 0);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_STRING:
    value._3_1_ = 1;
    value._2_1_ = FieldDescriptor::requires_utf8_validation((FieldDescriptor *)rep_enum);
  case TYPE_BYTES:
    value_15.contents_.data_.rep_.field_0._8_4_ = ReadSize((char **)&ctx_local);
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)(Message *)0x0;
    }
    CVar6 = FieldDescriptor::cpp_string_type((FieldDescriptor *)rep_enum);
    if (CVar6 == kCord) {
      absl::lts_20250127::Cord::Cord((Cord *)local_110);
      ctx_local = (ParseContext *)
                  EpsCopyInputStream::ReadCord
                            ((EpsCopyInputStream *)tag_local,(char *)ctx_local,
                             value_15.contents_.data_.rep_.field_0._8_4_,(Cord *)local_110);
      if (ctx_local == (ParseContext *)0x0) {
        msg_local = (Message *)0x0;
      }
      else {
        Reflection::SetString
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   (Cord *)local_110);
        msg_local = (Message *)ctx_local;
      }
      value_14.field_2._12_4_ = 1;
      absl::lts_20250127::Cord::~Cord((Cord *)local_110);
      return (char *)msg_local;
    }
    std::__cxx11::string::string((string *)local_138);
    ctx_local = (ParseContext *)
                EpsCopyInputStream::ReadString
                          ((EpsCopyInputStream *)tag_local,(char *)ctx_local,
                           value_15.contents_.data_.rep_.field_0._8_4_,(string *)local_138);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      if ((value._3_1_ & 1) != 0) {
        if ((value._2_1_ & 1) == 0) {
          pcVar15 = (char *)std::__cxx11::string::data();
          iVar5 = std::__cxx11::string::length();
          local_158 = FieldDescriptor::full_name((FieldDescriptor *)rep_enum);
          VerifyUTF8StringNamedField(pcVar15,iVar5,PARSE,local_158);
        }
        else {
          this_00 = (WireFormatLite *)std::__cxx11::string::data();
          uVar7 = std::__cxx11::string::length();
          local_148 = FieldDescriptor::full_name((FieldDescriptor *)rep_enum);
          field_name._M_str = (char *)field;
          field_name._M_len = (size_t)local_148._M_str;
          bVar1 = WireFormatLite::VerifyUtf8String
                            (this_00,(char *)(ulong)uVar7,0,(Operation)local_148._M_len,field_name);
          if (!bVar1) {
            msg_local = (Message *)0x0;
            goto LAB_0050a50f;
          }
        }
      }
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      pcVar15 = ptr_local;
      this = field_local;
      pRVar10 = rep_enum;
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_178,(string *)local_138);
        Reflection::AddString
                  ((Reflection *)this,(Message *)pcVar15,(FieldDescriptor *)pRVar10,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
      }
      else {
        std::__cxx11::string::string((string *)&local_198,(string *)local_138);
        Reflection::SetString
                  ((Reflection *)this,(Message *)pcVar15,(FieldDescriptor *)pRVar10,&local_198);
        std::__cxx11::string::~string((string *)&local_198);
      }
      msg_local = (Message *)ctx_local;
    }
LAB_0050a50f:
    value_14.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_138);
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
    msg_local = (Message *)
                HandleMessage((Message *)ptr_local,(char *)ctx_local,(ParseContext *)tag_local,
                              (uint64_t)reflection_local,(Reflection *)field_local,
                              (FieldDescriptor *)rep_enum);
    break;
  case TYPE_UINT32:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_int>((char *)ctx_local,(uint *)((long)&value_4 + 4));
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddUInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_4._4_4_);
      }
      else {
        Reflection::SetUInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_4._4_4_);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_ENUM:
    ctx_local = (ParseContext *)
                VarintParse<unsigned_int>
                          ((char *)ctx_local,
                           (uint *)(value_15.contents_.data_.rep_.field_0.data + 0xc));
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddEnumValue
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_15.contents_.data_.rep_.field_0._12_4_);
      }
      else {
        Reflection::SetEnumValue
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_15.contents_.data_.rep_.field_0._12_4_);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case TYPE_SFIXED32:
    iVar5 = UnalignedLoad<int>((char *)ctx_local);
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 4);
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar1) {
      Reflection::AddInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,iVar5);
    }
    else {
      Reflection::SetInt32
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,iVar5);
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_SFIXED64:
    value_19 = UnalignedLoad<long>((char *)ctx_local);
    ctx_local = (ParseContext *)&(ctx_local->super_EpsCopyInputStream).buffer_end_;
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
    if (bVar1) {
      Reflection::AddInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_19
                );
    }
    else {
      Reflection::SetInt64
                ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,value_19
                );
    }
    msg_local = (Message *)ctx_local;
    break;
  case TYPE_SINT32:
    value_16 = ReadVarintZigZag32((char **)&ctx_local);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_16);
      }
      else {
        Reflection::SetInt32
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_16);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  case MAX_TYPE:
    value_17 = ReadVarintZigZag64((char **)&ctx_local);
    if (ctx_local == (ParseContext *)0x0) {
      msg_local = (Message *)0x0;
    }
    else {
      bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)rep_enum);
      if (bVar1) {
        Reflection::AddInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_17);
      }
      else {
        Reflection::SetInt64
                  ((Reflection *)field_local,(Message *)ptr_local,(FieldDescriptor *)rep_enum,
                   value_17);
      }
      msg_local = (Message *)ctx_local;
    }
    break;
  default:
    msg_local = (Message *)0x0;
  }
  return (char *)msg_local;
}

Assistant:

const char* WireFormat::_InternalParseAndMergeField(
    Message* msg, const char* ptr, internal::ParseContext* ctx, uint64_t tag,
    const Reflection* reflection, const FieldDescriptor* field) {
  if (field == nullptr) {
    // unknown field set parser takes 64bit tags, because message set type ids
    // span the full 32 bit range making the tag span [0, 2^35) range.
    return internal::UnknownFieldParse(
        tag, reflection->MutableUnknownFields(msg), ptr, ctx);
  }
  if (WireFormatLite::GetTagWireType(tag) !=
      WireTypeForFieldType(field->type())) {
    if (field->is_packable() && WireFormatLite::GetTagWireType(tag) ==
                                    WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
      switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    ptr = internal::Packed##CPPTYPE_METHOD##Parser(                         \
        reflection->MutableRepeatedFieldInternal<CPPTYPE>(msg, field), ptr, \
        ctx);                                                               \
    return ptr;                                                             \
  }

        HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
        HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
        HANDLE_PACKED_TYPE(SINT32, int32_t, SInt32)
        HANDLE_PACKED_TYPE(SINT64, int64_t, SInt64)
        HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
        HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

        HANDLE_PACKED_TYPE(FIXED32, uint32_t, Fixed32)
        HANDLE_PACKED_TYPE(FIXED64, uint64_t, Fixed64)
        HANDLE_PACKED_TYPE(SFIXED32, int32_t, SFixed32)
        HANDLE_PACKED_TYPE(SFIXED64, int64_t, SFixed64)

        HANDLE_PACKED_TYPE(FLOAT, float, Float)
        HANDLE_PACKED_TYPE(DOUBLE, double, Double)

        HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

        case FieldDescriptor::TYPE_ENUM: {
          auto rep_enum =
              reflection->MutableRepeatedFieldInternal<int>(msg, field);
          if (!field->legacy_enum_field_treated_as_closed()) {
            ptr = internal::PackedEnumParser(rep_enum, ptr, ctx);
          } else {
            return ctx->ReadPackedVarint(
                ptr, [rep_enum, field, reflection, msg](int32_t val) {
                  if (field->enum_type()->FindValueByNumber(val) != nullptr) {
                    rep_enum->Add(val);
                  } else {
                    WriteVarint(field->number(), val,
                                reflection->MutableUnknownFields(msg));
                  }
                });
          }
          return ptr;
        }

        case FieldDescriptor::TYPE_STRING:
        case FieldDescriptor::TYPE_GROUP:
        case FieldDescriptor::TYPE_MESSAGE:
        case FieldDescriptor::TYPE_BYTES:
          ABSL_LOG(FATAL) << "Can't reach";
          return nullptr;
      }
    } else {
      // mismatched wiretype;
      return internal::UnknownFieldParse(
          tag, reflection->MutableUnknownFields(msg), ptr, ctx);
    }
  }

  // Non-packed value
  bool utf8_check = false;
  bool strict_utf8_check = false;
  switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    ptr = VarintParse(ptr, &value);                       \
    if (ptr == nullptr) return nullptr;                   \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

    HANDLE_TYPE(BOOL, uint64_t, Bool)
    HANDLE_TYPE(INT32, uint32_t, Int32)
    HANDLE_TYPE(INT64, uint64_t, Int64)
    HANDLE_TYPE(UINT32, uint32_t, UInt32)
    HANDLE_TYPE(UINT64, uint64_t, UInt64)

    case FieldDescriptor::TYPE_SINT32: {
      int32_t value = ReadVarintZigZag32(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt32(msg, field, value);
      } else {
        reflection->SetInt32(msg, field, value);
      }
      return ptr;
    }
    case FieldDescriptor::TYPE_SINT64: {
      int64_t value = ReadVarintZigZag64(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddInt64(msg, field, value);
      } else {
        reflection->SetInt64(msg, field, value);
      }
      return ptr;
    }
#undef HANDLE_TYPE
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)        \
  case FieldDescriptor::TYPE_##TYPE: {                    \
    CPPTYPE value;                                        \
    value = UnalignedLoad<CPPTYPE>(ptr);                  \
    ptr += sizeof(CPPTYPE);                               \
    if (field->is_repeated()) {                           \
      reflection->Add##CPPTYPE_METHOD(msg, field, value); \
    } else {                                              \
      reflection->Set##CPPTYPE_METHOD(msg, field, value); \
    }                                                     \
    return ptr;                                           \
  }

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

#undef HANDLE_TYPE

    case FieldDescriptor::TYPE_ENUM: {
      uint32_t value;
      ptr = VarintParse(ptr, &value);
      if (ptr == nullptr) return nullptr;
      if (field->is_repeated()) {
        reflection->AddEnumValue(msg, field, value);
      } else {
        reflection->SetEnumValue(msg, field, value);
      }
      return ptr;
    }

    // Handle strings separately so that we can optimize the ctype=CORD case.
    case FieldDescriptor::TYPE_STRING:
      utf8_check = true;
      strict_utf8_check = field->requires_utf8_validation();
      ABSL_FALLTHROUGH_INTENDED;
    case FieldDescriptor::TYPE_BYTES: {
      int size = ReadSize(&ptr);
      if (ptr == nullptr) return nullptr;
      if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
        absl::Cord value;
        ptr = ctx->ReadCord(ptr, size, &value);
        if (ptr == nullptr) return nullptr;
        reflection->SetString(msg, field, value);
        return ptr;
      }
      std::string value;
      ptr = ctx->ReadString(ptr, size, &value);
      if (ptr == nullptr) return nullptr;
      if (utf8_check) {
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name())) {
            return nullptr;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name());
        }
      }
      if (field->is_repeated()) {
        reflection->AddString(msg, field, std::move(value));
      } else {
        reflection->SetString(msg, field, std::move(value));
      }
      return ptr;
    }

    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return HandleMessage(msg, ptr, ctx, tag, reflection, field);
  }

  // GCC 8 complains about control reaching end of non-void function here.
  // Let's keep it happy by returning a nullptr.
  return nullptr;
}